

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

uint av1_get_variance_boost_block_variance(AV1_COMP *cpi,MACROBLOCK *x)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  long in_RSI;
  long *in_RDI;
  uint variance;
  int upper_index;
  int lower_index;
  int middle_index;
  int j;
  int subb_j;
  int i;
  int subb_i;
  aom_variance_fn_t vf;
  uint variances [64];
  uint8_t *all_zeros;
  int octile;
  uint sse;
  MACROBLOCKD *xd;
  uint8_t *local_158;
  int local_13c;
  int local_134;
  uint local_128 [31];
  int local_ac;
  int local_8c;
  int local_6c;
  uint8_t *local_28;
  undefined4 local_20;
  undefined1 local_1c [4];
  MACROBLOCKD *local_18;
  long local_10;
  long *local_8;
  
  local_18 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_20 = 5;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = is_cur_buf_hbd(local_18);
  if (iVar2 == 0) {
    local_158 = "";
  }
  else {
    local_158 = "";
  }
  local_28 = local_158;
  pcVar1 = *(code **)(*local_8 + 0xca68);
  for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
    for (local_13c = 0; local_13c < 8; local_13c = local_13c + 1) {
      uVar3 = (*pcVar1)(*(long *)(local_10 + 0x30) +
                        (long)(local_134 * 8 * *(int *)(local_10 + 0x48)) + (long)(local_13c << 3),
                        *(undefined4 *)(local_10 + 0x48),local_28,0,local_1c);
      local_128[local_134 * 8 + local_13c] = uVar3 >> 6;
    }
  }
  qsort(local_128,0x40,4,comp_unsigned_int);
  return local_ac + local_8c * 2 + local_6c + 2U >> 2;
}

Assistant:

unsigned int av1_get_variance_boost_block_variance(const AV1_COMP *cpi,
                                                   const MACROBLOCK *x) {
#define SUPERBLOCK_SIZE 64
#define SUBBLOCK_SIZE 8
#define SUBBLOCKS_IN_SB_DIM (SUPERBLOCK_SIZE / SUBBLOCK_SIZE)
#define SUBBLOCKS_IN_SB (SUBBLOCKS_IN_SB_DIM * SUBBLOCKS_IN_SB_DIM)
#define SUBBLOCKS_IN_OCTILE (SUBBLOCKS_IN_SB / 8)
  DECLARE_ALIGNED(16, static const uint16_t,
                  av1_highbd_all_zeros[SUBBLOCK_SIZE]) = { 0 };
  DECLARE_ALIGNED(16, static const uint8_t,
                  av1_all_zeros[SUBBLOCK_SIZE]) = { 0 };

  const MACROBLOCKD *xd = &x->e_mbd;
  unsigned int sse;
  // Octile is currently hard-coded and optimized for still pictures. In the
  // future, we might want to expose this as a parameter that can be fine-tuned
  // by the caller.
  // An octile of 5 was chosen because it was found to strike the best balance
  // between quality and consistency. Lower octiles tend to score lower in
  // SSIMU2, while higher octiles tend to harm subjective quality consistency,
  // especially in <1 MP images.
  const int octile = 5;
  const uint8_t *all_zeros = is_cur_buf_hbd(xd)
                                 ? CONVERT_TO_BYTEPTR(av1_highbd_all_zeros)
                                 : av1_all_zeros;
  unsigned int variances[SUBBLOCKS_IN_SB];

  // Calculate subblock variances.
  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_8X8].vf;
  for (int subb_i = 0; subb_i < SUBBLOCKS_IN_SB_DIM; subb_i++) {
    int i = subb_i * SUBBLOCK_SIZE;
    for (int subb_j = 0; subb_j < SUBBLOCKS_IN_SB_DIM; subb_j++) {
      int j = subb_j * SUBBLOCK_SIZE;
      // Truncating values to integers (i.e. the 64 term) was found to perform
      // better than rounding, or returning them as doubles.
      variances[subb_i * SUBBLOCKS_IN_SB_DIM + subb_j] =
          vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
             x->plane[0].src.stride, all_zeros, 0, &sse) /
          64;
    }
  }

  // Order the 8x8 SB values from smallest to largest variance.
  qsort(variances, SUBBLOCKS_IN_SB, sizeof(unsigned int), comp_unsigned_int);

  // Sample three 8x8 variance values: at the specified octile, previous octile,
  // and next octile. Make sure we use the last subblock in each octile as the
  // representative of the octile.
  assert(octile >= 1 && octile <= 8);
  const int middle_index = octile * SUBBLOCKS_IN_OCTILE - 1;
  const int lower_index =
      AOMMAX(SUBBLOCKS_IN_OCTILE - 1, middle_index - SUBBLOCKS_IN_OCTILE);
  const int upper_index =
      AOMMIN(SUBBLOCKS_IN_SB - 1, middle_index + SUBBLOCKS_IN_OCTILE);

  // Weigh the three variances in a 1:2:1 ratio, with rounding (the +2 term).
  // This allows for smoother delta-q transitions among superblocks with
  // mixed-variance features.
  const unsigned int variance =
      (variances[lower_index] + (variances[middle_index] * 2) +
       variances[upper_index] + 2) /
      4;

  return variance;
}